

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_lore_counts(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    wVar1 = parser_getint(p,"sights");
    *(short *)((long)pvVar2 + 4) = (short)wVar1;
    wVar1 = parser_getint(p,"deaths");
    *(short *)((long)pvVar2 + 6) = (short)wVar1;
    wVar1 = parser_getint(p,"tkills");
    *(short *)((long)pvVar2 + 0xc) = (short)wVar1;
    wVar1 = parser_getint(p,"wake");
    *(char *)((long)pvVar2 + 0xe) = (char)wVar1;
    wVar1 = parser_getint(p,"ignore");
    *(char *)((long)pvVar2 + 0xf) = (char)wVar1;
    wVar1 = parser_getint(p,"innate");
    *(char *)((long)pvVar2 + 0x12) = (char)wVar1;
    wVar1 = parser_getint(p,"spell");
    *(char *)((long)pvVar2 + 0x13) = (char)wVar1;
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_lore_counts(struct parser *p) {
	struct monster_lore *l = parser_priv(p);

	if (!l)
		return PARSE_ERROR_NONE;
	l->sights = parser_getint(p, "sights");
	l->deaths = parser_getint(p, "deaths");
	l->tkills = parser_getint(p, "tkills");
	l->wake = parser_getint(p, "wake");
	l->ignore = parser_getint(p, "ignore");
	l->cast_innate = parser_getint(p, "innate");
	l->cast_spell = parser_getint(p, "spell");

	return PARSE_ERROR_NONE;
}